

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backup.cpp
# Opt level: O0

void wallet::EnsureBlockDataFromTime(CWallet *wallet,int64_t timestamp)

{
  uint uVar1;
  Chain *args;
  anon_class_8_1_71be4537 *this;
  FoundBlock *pFVar2;
  undefined8 uVar3;
  long in_RSI;
  long in_FS_OFFSET;
  bool found;
  Chain *chain;
  int height;
  uint256 tip_hash;
  FoundBlock *in_stack_fffffffffffffee8;
  int *in_stack_fffffffffffffef0;
  CWallet *in_stack_fffffffffffffef8;
  string *in_stack_ffffffffffffff28;
  Chain *pCVar4;
  Chain *pCVar5;
  int code;
  undefined8 local_a0;
  undefined1 local_98 [112];
  undefined1 local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  args = CWallet::chain(in_stack_fffffffffffffef8);
  uVar1 = (*args->_vptr_Chain[0x21])();
  if ((uVar1 & 1) != 0) {
    this = (anon_class_8_1_71be4537 *)(in_RSI + -0x1c20);
    pCVar4 = args;
    memset(local_98,0,0x50);
    interfaces::FoundBlock::FoundBlock(in_stack_fffffffffffffee8);
    pFVar2 = interfaces::FoundBlock::height
                       ((FoundBlock *)in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
    uVar1 = (*args->_vptr_Chain[0xb])(args,this,0,pFVar2);
    MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
              ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffffee8);
    EnsureBlockDataFromTime::anon_class_8_1_71be4537::operator()(this);
    if ((uVar1 & 1) != 0) {
      pCVar5 = pCVar4;
      std::optional<int>::optional((optional<int> *)in_stack_fffffffffffffee8);
      code = (int)((ulong)pCVar5 >> 0x20);
      uVar1 = (*pCVar4->_vptr_Chain[0x11])(pCVar4,local_28,0,local_a0);
      if ((uVar1 & 1) == 0) {
        uVar3 = __cxa_allocate_exception(0x58);
        tinyformat::format<int>((char *)this,(int *)args);
        JSONRPCError(code,in_stack_ffffffffffffff28);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
          __cxa_throw(uVar3,&UniValue::typeinfo,UniValue::~UniValue);
        }
        goto LAB_015dcb87;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
LAB_015dcb87:
  __stack_chk_fail();
}

Assistant:

static void EnsureBlockDataFromTime(const CWallet& wallet, int64_t timestamp)
{
    auto& chain{wallet.chain()};
    if (!chain.havePruned()) {
        return;
    }

    int height{0};
    const bool found{chain.findFirstBlockWithTimeAndHeight(timestamp - TIMESTAMP_WINDOW, 0, FoundBlock().height(height))};

    uint256 tip_hash{WITH_LOCK(wallet.cs_wallet, return wallet.GetLastBlockHash())};
    if (found && !chain.hasBlocks(tip_hash, height)) {
        throw JSONRPCError(RPC_WALLET_ERROR, strprintf("Pruned blocks from height %d required to import keys. Use RPC call getblockchaininfo to determine your pruned height.", height));
    }
}